

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int bcholu(double *A,int N)

{
  int iVar1;
  double *UT_00;
  double *UB_00;
  double *UT;
  double *UB;
  int sc;
  int b;
  int t;
  int j;
  int i;
  int stride;
  int N_local;
  double *A_local;
  
  UT_00 = (double *)malloc((long)N * 8 * (long)N);
  UB_00 = (double *)malloc(0x8000);
  iVar1 = rbcholu(A,N,N,UB_00,UT_00);
  for (t = 0; t < N; t = t + 1) {
    for (b = 0; b < t; b = b + 1) {
      A[t * N + b] = 0.0;
    }
  }
  free(UB_00);
  free(UT_00);
  return iVar1;
}

Assistant:

int bcholu(double *A, int N) {
	int stride,i,j,t,b,sc;
	double *UB,*UT;
	b = (int) BLOCKSIZE;
	UT = (double*) malloc(sizeof(double) * N * N);
	UB = (double*) malloc(sizeof(double) * b * b);
	stride = N; 
	
	sc = rbcholu(A,N,stride,UB,UT);
	
	for(i=0; i < N;++i) {
		t = i *N;
		for(j=0;j < i;++j) {
			A[t+j] = 0.;
		}
	}

	free(UB);
	free(UT);
	
	return sc;
	
}